

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

IterateResult __thiscall VertexAttrib64Bit::Base::IterateStop(Base *this,bool result)

{
  char *description;
  undefined7 in_register_00000031;
  bool bVar1;
  
  bVar1 = (int)CONCAT71(in_register_00000031,result) == 0;
  if (bVar1) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,description)
  ;
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult Base::IterateStop(bool result) const
{
	/* Set test result */
	if (false == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	/* Done */
	return tcu::TestNode::STOP;
}